

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Nonlin.c
# Opt level: O1

int Llb_NonlinReachability(Llb_Mnn_t *p)

{
  DdManager *dd;
  Vec_Ptr_t *pVVar1;
  int *pVar2Lev;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  DdNode *pDVar7;
  DdManager *pDVar8;
  void **ppvVar9;
  DdNode *pDVar10;
  Gia_ParLlb_t *pGVar11;
  Abc_Cex_t *pAVar12;
  long lVar13;
  abctime aVar14;
  abctime time;
  abctime time_00;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  char *pcVar18;
  Llb_Mnn_t *pLVar19;
  long lVar20;
  double dVar21;
  timespec ts;
  timespec local_68;
  double local_58;
  uint local_4c;
  double local_48;
  uint local_3c;
  long local_38;
  
  iVar2 = clock_gettime(3,&local_68);
  if (iVar2 < 0) {
    lVar20 = -1;
  }
  else {
    lVar20 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
  }
  if (p->pAig->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(p->pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb3Nonlin.c"
                  ,0x1b2,"int Llb_NonlinReachability(Llb_Mnn_t *)");
  }
  lVar6 = (long)p->pPars->TimeLimit;
  if (lVar6 == 0) {
    aVar14 = 0;
  }
  else {
    iVar2 = clock_gettime(3,&local_68);
    if (iVar2 < 0) {
      lVar13 = -1;
    }
    else {
      lVar13 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
    }
    aVar14 = lVar13 + lVar6 * 1000000;
  }
  p->pPars->TimeTarget = aVar14;
  pDVar8 = p->dd;
  pDVar8->TimeStop = aVar14;
  p->ddG->TimeStop = aVar14;
  dd = p->ddR;
  dd->TimeStop = aVar14;
  if (pDVar8->bFunc != (DdNode *)0x0) {
    __assert_fail("p->dd->bFunc == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb3Nonlin.c"
                  ,0x1bd,"int Llb_NonlinReachability(Llb_Mnn_t *)");
  }
  pDVar7 = Llb_BddComputeBad(p->pInit,dd,aVar14);
  p->ddR->bFunc = pDVar7;
  if (pDVar7 != (DdNode *)0x0) {
    Cudd_Ref(pDVar7);
    Cudd_Quit(p->dd);
    pDVar8 = Llb_NonlinImageStart
                       (p->pAig,p->vLeaves,p->vRoots,p->pVars2Q,p->pOrderL,1,p->pPars->TimeTarget);
    p->dd = pDVar8;
    if (pDVar8 != (DdManager *)0x0) {
      local_38 = lVar20;
      pDVar7 = Llb_NonlinComputeInitState(p->pAig,pDVar8);
      p->dd->bFunc = pDVar7;
      Cudd_Ref(pDVar7);
      pDVar7 = Llb_NonlinComputeInitState(p->pAig,p->ddG);
      p->ddG->bFunc = pDVar7;
      Cudd_Ref(pDVar7);
      pDVar7 = Llb_NonlinComputeInitState(p->pAig,p->ddG);
      p->ddG->bFunc2 = pDVar7;
      Cudd_Ref(pDVar7);
      if (p->pPars->nIterMax < 1) {
        local_4c = 0xffffffff;
        uVar15 = 0;
      }
      else {
        uVar15 = 0;
        do {
          iVar2 = clock_gettime(3,&local_68);
          if (iVar2 < 0) {
            dVar21 = 4.94065645841247e-324;
          }
          else {
            lVar20 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
            dVar21 = (double)(((lVar20 >> 7) - (lVar20 >> 0x3f)) + local_68.tv_sec * -1000000);
          }
          if (p->pPars->TimeLimit != 0) {
            iVar2 = clock_gettime(3,&local_68);
            if (iVar2 < 0) {
              lVar20 = -1;
            }
            else {
              lVar20 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
            }
            pGVar11 = p->pPars;
            if (lVar20 <= pGVar11->TimeTarget) goto LAB_00838618;
            if (pGVar11->fSilent == 0) {
              uVar16 = (ulong)(uint)pGVar11->TimeLimit;
              pcVar18 = "Reached timeout (%d seconds) during image computation.\n";
              goto LAB_0083901a;
            }
LAB_00839021:
            uVar15 = uVar15 - 1;
LAB_00839023:
            p->pPars->iFrame = uVar15;
LAB_0083902a:
            Llb_NonlinImageQuit();
            return -1;
          }
LAB_00838618:
          pDVar7 = Extra_TransferPermute(p->dd,p->ddR,p->dd->bFunc,p->vCs2Glo->pArray);
          if (pDVar7 == (DdNode *)0x0) {
            if (p->pPars->fSilent == 0) {
              uVar16 = (ulong)(uint)p->pPars->TimeLimit;
              pcVar18 = "Reached timeout (%d seconds) during ring transfer.\n";
LAB_0083901a:
              printf(pcVar18,uVar16);
            }
            goto LAB_00839021;
          }
          local_58 = (double)CONCAT44(local_58._4_4_,uVar15);
          local_48 = dVar21;
          Cudd_Ref(pDVar7);
          pVVar1 = p->vRings;
          uVar15 = pVVar1->nCap;
          if (pVVar1->nSize == uVar15) {
            if ((int)uVar15 < 0x10) {
              if (pVVar1->pArray == (void **)0x0) {
                ppvVar9 = (void **)malloc(0x80);
              }
              else {
                ppvVar9 = (void **)realloc(pVVar1->pArray,0x80);
              }
              pVVar1->pArray = ppvVar9;
              iVar2 = 0x10;
            }
            else {
              iVar2 = uVar15 * 2;
              if (iVar2 <= (int)uVar15) goto LAB_008386c3;
              if (pVVar1->pArray == (void **)0x0) {
                ppvVar9 = (void **)malloc((ulong)uVar15 << 4);
              }
              else {
                ppvVar9 = (void **)realloc(pVVar1->pArray,(ulong)uVar15 << 4);
              }
              pVVar1->pArray = ppvVar9;
            }
            pVVar1->nCap = iVar2;
          }
LAB_008386c3:
          iVar2 = pVVar1->nSize;
          pVVar1->nSize = iVar2 + 1;
          pVVar1->pArray[iVar2] = pDVar7;
          if (p->pPars->fSkipOutCheck == 0) {
            pDVar8 = p->ddR;
            iVar2 = Cudd_bddLeq(pDVar8,pDVar7,(DdNode *)((ulong)pDVar8->bFunc ^ 1));
            dVar21 = local_58;
            iVar17 = (int)pDVar8;
            if (iVar2 == 0) {
              if (p->pInit->pSeqModel != (Abc_Cex_t *)0x0) {
                __assert_fail("p->pInit->pSeqModel == NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb3Nonlin.c"
                              ,0x1f5,"int Llb_NonlinReachability(Llb_Mnn_t *)");
              }
              iVar2 = local_58._0_4_;
              if (p->pPars->fBackward == 0) {
                pLVar19 = p;
                pAVar12 = Llb_NonlinDeriveCex(p);
                iVar17 = (int)pLVar19;
                p->pInit->pSeqModel = pAVar12;
              }
              if (p->pPars->fSilent == 0) {
                if (p->pPars->fBackward == 0) {
                  Abc_Print(iVar17,"Output %d of miter \"%s\" was asserted in frame %d.  ",
                            (ulong)(uint)p->pInit->pSeqModel->iPo,(ulong)dVar21 & 0xffffffff);
                }
                else {
                  Abc_Print(iVar17,
                            "Output ??? was asserted in frame %d (counter-example is not produced).  "
                            ,(ulong)dVar21 & 0xffffffff);
                }
                aVar14 = Abc_Clock();
                Abc_PrintTime(0xa00e9c,(char *)(aVar14 - local_38),time_00);
              }
              p->pPars->iFrame = iVar2 + -1;
              Llb_NonlinImageQuit();
              return 0;
            }
          }
          iVar2 = clock_gettime(3,&local_68);
          if (iVar2 < 0) {
            lVar20 = 1;
          }
          else {
            lVar20 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
            lVar20 = ((lVar20 >> 7) - (lVar20 >> 0x3f)) + local_68.tv_sec * -1000000;
          }
          local_3c = Cudd_DagSize(p->dd->bFunc);
          pDVar7 = Llb_NonlinImageCompute(p->dd->bFunc,p->pPars->fReorder,0,1,p->pOrderL);
          if (pDVar7 == (DdNode *)0x0) {
            if (p->pPars->fSilent == 0) {
              printf("Reached timeout (%d seconds) during image computation in quantification.\n",
                     (ulong)(uint)p->pPars->TimeLimit);
            }
            p->pPars->iFrame = local_58._0_4_ + -1;
            goto LAB_0083902a;
          }
          Cudd_Ref(pDVar7);
          local_4c = Cudd_DagSize(pDVar7);
          iVar2 = clock_gettime(3,&local_68);
          if (iVar2 < 0) {
            lVar6 = -1;
          }
          else {
            lVar6 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
          }
          p->timeImage = p->timeImage + lVar6 + lVar20;
          iVar2 = clock_gettime(3,&local_68);
          if (iVar2 < 0) {
            lVar20 = 1;
          }
          else {
            lVar20 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
            lVar20 = ((lVar20 >> 7) - (lVar20 >> 0x3f)) + local_68.tv_sec * -1000000;
          }
          Cudd_RecursiveDeref(p->ddG,p->ddG->bFunc2);
          pDVar10 = Extra_TransferPermute(p->dd,p->ddG,pDVar7,p->vNs2Glo->pArray);
          p->ddG->bFunc2 = pDVar10;
          if (pDVar10 == (DdNode *)0x0) {
            if (p->pPars->fSilent == 0) {
              printf("Reached timeout (%d seconds) during image computation in transfer 1.\n",
                     (ulong)(uint)p->pPars->TimeLimit);
            }
            p->pPars->iFrame = local_58._0_4_ + -1;
            pDVar8 = p->dd;
LAB_00838fa4:
            Cudd_RecursiveDeref(pDVar8,pDVar7);
            goto LAB_0083902a;
          }
          Cudd_Ref(pDVar10);
          Cudd_RecursiveDeref(p->dd,pDVar7);
          iVar2 = clock_gettime(3,&local_68);
          if (iVar2 < 0) {
            lVar6 = -1;
          }
          else {
            lVar6 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
          }
          p->timeTran1 = p->timeTran1 + lVar6 + lVar20;
          pDVar8 = p->dd;
          pVar2Lev = p->pOrderL2;
          uVar3 = Llb_NonlinCompPerms(pDVar8,pVar2Lev);
          memcpy(pVar2Lev,pDVar8->perm,(long)pDVar8->size << 2);
          lVar20 = Cudd_ReadReorderingTime(p->dd);
          p->timeReo = p->timeReo + lVar20;
          iVar2 = Cudd_ReadReorderings(p->dd);
          p->ddLocReos = p->ddLocReos + iVar2;
          iVar2 = Cudd_ReadGarbageCollections(p->dd);
          p->ddLocGrbs = p->ddLocGrbs + iVar2;
          Llb_NonlinImageQuit();
          pDVar8 = Llb_NonlinImageStart
                             (p->pAig,p->vLeaves,p->vRoots,p->pVars2Q,p->pOrderL,0,
                              p->pPars->TimeTarget);
          p->dd = pDVar8;
          if (pDVar8 == (DdManager *)0x0) {
            if (p->pPars->fSilent == 0) {
              printf("Reached timeout (%d seconds) during constructing the bad states.\n",
                     (ulong)(uint)p->pPars->TimeLimit);
            }
            iVar2 = local_58._0_4_ + -1;
            pGVar11 = p->pPars;
            goto LAB_00838eb0;
          }
          iVar2 = clock_gettime(3,&local_68);
          if (iVar2 < 0) {
            lVar20 = 1;
          }
          else {
            lVar20 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
            lVar20 = ((lVar20 >> 7) - (lVar20 >> 0x3f)) + local_68.tv_sec * -1000000;
          }
          pDVar8 = p->ddG;
          pDVar7 = pDVar8->bFunc2;
          pDVar10 = Cudd_bddAnd(pDVar8,pDVar7,(DdNode *)((ulong)pDVar8->bFunc ^ 1));
          p->ddG->bFunc2 = pDVar10;
          if (pDVar10 == (DdNode *)0x0) {
LAB_00838efa:
            if (p->pPars->fSilent == 0) {
              printf("Reached timeout (%d seconds) during image computation in transfer 1.\n",
                     (ulong)(uint)p->pPars->TimeLimit);
            }
            p->pPars->iFrame = local_58._0_4_ + -1;
            pDVar8 = p->ddG;
            goto LAB_00838fa4;
          }
          Cudd_Ref(pDVar10);
          Cudd_RecursiveDeref(p->ddG,pDVar7);
          iVar2 = clock_gettime(3,&local_68);
          if (iVar2 < 0) {
            lVar6 = -1;
          }
          else {
            lVar6 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
          }
          p->timeGloba = p->timeGloba + lVar6 + lVar20;
          if (*(int *)((ulong)p->ddG->bFunc2 & 0xfffffffffffffffe) == 0x7fffffff) {
            uVar15 = local_58._0_4_;
            break;
          }
          iVar2 = clock_gettime(3,&local_68);
          if (iVar2 < 0) {
            lVar20 = 1;
          }
          else {
            lVar20 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
            lVar20 = ((lVar20 >> 7) - (lVar20 >> 0x3f)) + local_68.tv_sec * -1000000;
          }
          pDVar8 = p->ddG;
          pDVar7 = pDVar8->bFunc;
          pDVar10 = Cudd_bddOr(pDVar8,pDVar7,pDVar8->bFunc2);
          p->ddG->bFunc = pDVar10;
          if (pDVar10 == (DdNode *)0x0) goto LAB_00838efa;
          Cudd_Ref(pDVar10);
          Cudd_RecursiveDeref(p->ddG,pDVar7);
          iVar2 = clock_gettime(3,&local_68);
          if (iVar2 < 0) {
            lVar6 = -1;
          }
          else {
            lVar6 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
          }
          p->timeGloba = p->timeGloba + lVar6 + lVar20;
          iVar2 = clock_gettime(3,&local_68);
          dVar21 = local_58;
          uVar15 = local_58._0_4_;
          if (iVar2 < 0) {
            lVar20 = 1;
          }
          else {
            lVar20 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
            lVar20 = ((lVar20 >> 7) - (lVar20 >> 0x3f)) + local_68.tv_sec * -1000000;
          }
          pDVar7 = Extra_TransferPermute(p->ddG,p->dd,p->ddG->bFunc2,p->vGlo2Cs->pArray);
          p->dd->bFunc = pDVar7;
          if (pDVar7 == (DdNode *)0x0) {
            if (p->pPars->fSilent == 0) {
              uVar16 = (ulong)(uint)p->pPars->TimeLimit;
              pcVar18 = "Reached timeout (%d seconds) during image computation in transfer 2.\n";
              goto LAB_0083901a;
            }
            goto LAB_00839021;
          }
          Cudd_Ref(pDVar7);
          iVar2 = clock_gettime(3,&local_68);
          if (iVar2 < 0) {
            lVar6 = -1;
          }
          else {
            lVar6 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
          }
          p->timeTran2 = p->timeTran2 + lVar6 + lVar20;
          if (p->pPars->fVerbose != 0) {
            printf("I =%3d : ",(ulong)dVar21 & 0xffffffff);
            printf("Fr =%7d ",(ulong)local_3c);
            printf("Im =%7d  ",(ulong)local_4c);
            printf("(%4d %4d)  ",(ulong)(uint)p->ddLocReos,(ulong)(uint)p->ddLocGrbs);
            uVar4 = Cudd_DagSize(p->ddG->bFunc);
            printf("Rea =%6d  ",(ulong)uVar4);
            uVar4 = Cudd_ReadReorderings(p->ddG);
            uVar5 = Cudd_ReadGarbageCollections(p->ddG);
            printf("(%4d %4d)  ",(ulong)uVar4,(ulong)uVar5);
            printf("S =%4d ",(ulong)(uint)nSuppMax);
            printf("cL =%5d ",(ulong)uVar3);
            uVar3 = Llb_NonlinCompPerms(p->ddG,p->pOrderG);
            printf("cG =%5d ",(ulong)uVar3);
            iVar17 = 3;
            iVar2 = clock_gettime(3,&local_68);
            if (iVar2 < 0) {
              lVar20 = -1;
            }
            else {
              lVar20 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
            }
            lVar20 = lVar20 + (long)local_48;
            Abc_Print(iVar17,"%s =","T");
            Abc_Print(iVar17,"%9.2f sec\n",(double)lVar20 / 1000000.0);
            memcpy(p->pOrderG,p->ddG->perm,(long)p->ddG->size << 2);
          }
          if (uVar15 == p->pPars->nIterMax - 1U) {
            if (p->pPars->fSilent == 0) {
              printf("Reached limit on the number of timeframes (%d).\n");
            }
            goto LAB_00839023;
          }
          uVar15 = uVar15 + 1;
        } while ((int)uVar15 < p->pPars->nIterMax);
      }
      Llb_NonlinImageQuit();
      if (p->pPars->fVerbose != 0) {
        local_58 = Cudd_CountMinterm(p->ddG,p->ddG->bFunc,p->pAig->nRegs);
        if ((int)uVar15 < p->pPars->nIterMax) {
          pcVar18 = "Reachability analysis completed after %d frames.\n";
          if (p->pPars->nBddMax < (int)local_4c) {
            pcVar18 = "Reachability analysis is stopped after %d frames.\n";
          }
        }
        else {
          pcVar18 = "Reachability analysis is stopped after %d frames.\n";
        }
        printf(pcVar18,(ulong)uVar15);
        local_48 = local_58 * 100.0;
        dVar21 = ldexp(1.0,p->pAig->nRegs);
        printf("Reachable states = %.0f. (Ratio = %.4f %%)\n",local_58,local_48 / dVar21);
        fflush(_stdout);
      }
      pGVar11 = p->pPars;
      if (((int)uVar15 < pGVar11->nIterMax) && ((int)local_4c <= pGVar11->nBddMax)) {
        if (pGVar11->fSilent == 0) {
          printf("The miter is proved unreachable after %d iterations.  ",(ulong)uVar15);
        }
        p->pPars->iFrame = uVar15 - 1;
        aVar14 = Abc_Clock();
        Abc_PrintTime(0xa00e9c,(char *)(aVar14 - local_38),time);
        return 1;
      }
      if (pGVar11->fSilent == 0) {
        printf("Verified only for states reachable in %d frames.  ",(ulong)uVar15);
      }
      pGVar11 = p->pPars;
      iVar2 = pGVar11->nIterMax;
LAB_00838eb0:
      pGVar11->iFrame = iVar2;
      return -1;
    }
  }
  if (p->pPars->fSilent == 0) {
    printf("Reached timeout (%d seconds) during constructing the bad states.\n",
           (ulong)(uint)p->pPars->TimeLimit);
  }
  p->pPars->iFrame = -1;
  return -1;
}

Assistant:

int Llb_NonlinReachability( Llb_Mnn_t * p )
{ 
    DdNode * bTemp, * bNext;
    int nIters, nBddSize0, nBddSize = -1, NumCmp;//, Limit = p->pPars->nBddMax;
    abctime clk2, clk3, clk = Abc_Clock();
    assert( Aig_ManRegNum(p->pAig) > 0 );

    // compute time to stop
    p->pPars->TimeTarget = p->pPars->TimeLimit ? p->pPars->TimeLimit * CLOCKS_PER_SEC + Abc_Clock(): 0;

    // set the stop time parameter
    p->dd->TimeStop  = p->pPars->TimeTarget;
    p->ddG->TimeStop = p->pPars->TimeTarget;
    p->ddR->TimeStop = p->pPars->TimeTarget;

    // set reordering hooks
    assert( p->dd->bFunc == NULL );
//    p->dd->bFunc = (DdNode *)p->pAig;
//    Cudd_AddHook( p->dd, Llb_NonlinReoHook, CUDD_POST_REORDERING_HOOK );

    // create bad state in the ring manager
    p->ddR->bFunc  = Llb_BddComputeBad( p->pInit, p->ddR, p->pPars->TimeTarget );          
    if ( p->ddR->bFunc == NULL )
    {
        if ( !p->pPars->fSilent )
            printf( "Reached timeout (%d seconds) during constructing the bad states.\n", p->pPars->TimeLimit );
        p->pPars->iFrame = -1;
        return -1;
    }
    Cudd_Ref( p->ddR->bFunc );
    // compute the starting set of states
    Cudd_Quit( p->dd );
    p->dd = Llb_NonlinImageStart( p->pAig, p->vLeaves, p->vRoots, p->pVars2Q, p->pOrderL, 1, p->pPars->TimeTarget );
    if ( p->dd == NULL )
    {
        if ( !p->pPars->fSilent )
            printf( "Reached timeout (%d seconds) during constructing the bad states.\n", p->pPars->TimeLimit );
        p->pPars->iFrame = -1;
        return -1;
    }
    p->dd->bFunc   = Llb_NonlinComputeInitState( p->pAig, p->dd );   Cudd_Ref( p->dd->bFunc );   // current
    p->ddG->bFunc  = Llb_NonlinComputeInitState( p->pAig, p->ddG );  Cudd_Ref( p->ddG->bFunc );  // reached
    p->ddG->bFunc2 = Llb_NonlinComputeInitState( p->pAig, p->ddG );  Cudd_Ref( p->ddG->bFunc2 ); // frontier 
    for ( nIters = 0; nIters < p->pPars->nIterMax; nIters++ )
    { 
        // check the runtime limit
        clk2 = Abc_Clock();
        if ( p->pPars->TimeLimit && Abc_Clock() > p->pPars->TimeTarget )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Llb_NonlinImageQuit();
            return -1;
        }

        // save the onion ring
        bTemp = Extra_TransferPermute( p->dd, p->ddR, p->dd->bFunc, Vec_IntArray(p->vCs2Glo) );
        if ( bTemp == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during ring transfer.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Llb_NonlinImageQuit();
            return -1;
        }
        Cudd_Ref( bTemp );
        Vec_PtrPush( p->vRings, bTemp );

        // check it for bad states
        if ( !p->pPars->fSkipOutCheck && !Cudd_bddLeq( p->ddR, bTemp, Cudd_Not(p->ddR->bFunc) ) ) 
        {
            assert( p->pInit->pSeqModel == NULL );
            if ( !p->pPars->fBackward )
                p->pInit->pSeqModel = Llb_NonlinDeriveCex( p ); 
            if ( !p->pPars->fSilent )
            {
                if ( !p->pPars->fBackward )
                    Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d.  ", p->pInit->pSeqModel->iPo, nIters );
                else
                    Abc_Print( 1, "Output ??? was asserted in frame %d (counter-example is not produced).  ", nIters );
                Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            }
            p->pPars->iFrame = nIters - 1;
            Llb_NonlinImageQuit();
            return 0;
        }

        // compute the next states
        clk3 = Abc_Clock();
        nBddSize0 = Cudd_DagSize( p->dd->bFunc );
        bNext = Llb_NonlinImageCompute( p->dd->bFunc, p->pPars->fReorder, 0, 1, p->pOrderL ); // consumes ref   
//        bNext = Llb_NonlinImage( p->pAig, p->vLeaves, p->vRoots, p->pVars2Q, p->dd, bCurrent, 
//            p->pPars->fReorder, p->pPars->fVeryVerbose, NULL, ABC_INFINITY, p->pPars->TimeTarget );
        if ( bNext == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in quantification.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Llb_NonlinImageQuit();
            return -1;
        }
        Cudd_Ref( bNext );
        nBddSize = Cudd_DagSize( bNext );
        p->timeImage += Abc_Clock() - clk3;


        // transfer to the state manager
        clk3 = Abc_Clock();
        Cudd_RecursiveDeref( p->ddG, p->ddG->bFunc2 );
        p->ddG->bFunc2 = Extra_TransferPermute( p->dd, p->ddG, bNext, Vec_IntArray(p->vNs2Glo) );    
//        p->ddG->bFunc2 = Extra_bddAndPermute( p->ddG, Cudd_Not(p->ddG->bFunc), p->dd, bNext, Vec_IntArray(p->vNs2Glo) );    
        if ( p->ddG->bFunc2 == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in transfer 1.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->dd,  bNext );  
            Llb_NonlinImageQuit();
            return -1;
        }
        Cudd_Ref( p->ddG->bFunc2 );
        Cudd_RecursiveDeref( p->dd, bNext );
        p->timeTran1 += Abc_Clock() - clk3;

        // save permutation
        NumCmp = Llb_NonlinCompPerms( p->dd, p->pOrderL2 );
        // save order before image computation
        memcpy( p->pOrderL2, p->dd->perm, sizeof(int) * p->dd->size );
        // update the image computation manager
        p->timeReo   += Cudd_ReadReorderingTime(p->dd);
        p->ddLocReos += Cudd_ReadReorderings(p->dd);
        p->ddLocGrbs += Cudd_ReadGarbageCollections(p->dd);
        Llb_NonlinImageQuit();
        p->dd = Llb_NonlinImageStart( p->pAig, p->vLeaves, p->vRoots, p->pVars2Q, p->pOrderL, 0, p->pPars->TimeTarget );
        if ( p->dd == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during constructing the bad states.\n", p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            return -1;
        }
        //Extra_TestAndPerm( p->ddG, Cudd_Not(p->ddG->bFunc), p->ddG->bFunc2 );    

        // derive new states
        clk3 = Abc_Clock();
        p->ddG->bFunc2 = Cudd_bddAnd( p->ddG, bTemp = p->ddG->bFunc2, Cudd_Not(p->ddG->bFunc) );     
        if ( p->ddG->bFunc2 == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in transfer 1.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->ddG, bTemp );  
            Llb_NonlinImageQuit();
            return -1;
        }
        Cudd_Ref( p->ddG->bFunc2 );
        Cudd_RecursiveDeref( p->ddG, bTemp );
        p->timeGloba += Abc_Clock() - clk3;

        if ( Cudd_IsConstant(p->ddG->bFunc2) )
            break;
        // add to the reached set
        clk3 = Abc_Clock();
        p->ddG->bFunc = Cudd_bddOr( p->ddG, bTemp = p->ddG->bFunc, p->ddG->bFunc2 );                 
        if ( p->ddG->bFunc == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in transfer 1.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->ddG, bTemp );  
            Llb_NonlinImageQuit();
            return -1;
        }
        Cudd_Ref( p->ddG->bFunc );
        Cudd_RecursiveDeref( p->ddG, bTemp );
        p->timeGloba += Abc_Clock() - clk3;

        // reset permutation
//        RetValue = Cudd_CheckZeroRef( dd );
//        assert( RetValue == 0 );
//        Cudd_ShuffleHeap( dd, pOrderG );

        // move new states to the working manager
        clk3 = Abc_Clock();
        p->dd->bFunc = Extra_TransferPermute( p->ddG, p->dd, p->ddG->bFunc2, Vec_IntArray(p->vGlo2Cs) ); 
        if ( p->dd->bFunc == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in transfer 2.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Llb_NonlinImageQuit();
            return -1;
        }
        Cudd_Ref( p->dd->bFunc );
        p->timeTran2 += Abc_Clock() - clk3;

        // report the results
        if ( p->pPars->fVerbose )
        {
            printf( "I =%3d : ",   nIters );
            printf( "Fr =%7d ",    nBddSize0 );
            printf( "Im =%7d  ",   nBddSize );
            printf( "(%4d %4d)  ", p->ddLocReos, p->ddLocGrbs );
            printf( "Rea =%6d  ",  Cudd_DagSize(p->ddG->bFunc) );
            printf( "(%4d %4d)  ", Cudd_ReadReorderings(p->ddG), Cudd_ReadGarbageCollections(p->ddG) );
            printf( "S =%4d ",     nSuppMax );
            printf( "cL =%5d ",    NumCmp );
            printf( "cG =%5d ",    Llb_NonlinCompPerms( p->ddG, p->pOrderG ) );
            Abc_PrintTime( 1, "T", Abc_Clock() - clk2 );
            memcpy( p->pOrderG, p->ddG->perm, sizeof(int) * p->ddG->size );
        }
/*
        if ( pPars->fVerbose )
        {
            double nMints = Cudd_CountMinterm(ddG, bReached, Saig_ManRegNum(pAig) );
//            Extra_bddPrint( ddG, bReached );printf( "\n" );
            printf( "Reachable states = %.0f. (Ratio = %.4f %%)\n", nMints, 100.0*nMints/pow(2.0, Saig_ManRegNum(pAig)) );
            fflush( stdout ); 
        }
*/
        if ( nIters == p->pPars->nIterMax - 1 )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached limit on the number of timeframes (%d).\n",  p->pPars->nIterMax );
            p->pPars->iFrame = nIters;
            Llb_NonlinImageQuit();
            return -1;
        }
    }
    Llb_NonlinImageQuit();
    
    // report the stats
    if ( p->pPars->fVerbose )
    {
        double nMints = Cudd_CountMinterm(p->ddG, p->ddG->bFunc, Saig_ManRegNum(p->pAig) );
        if ( nIters >= p->pPars->nIterMax || nBddSize > p->pPars->nBddMax )
            printf( "Reachability analysis is stopped after %d frames.\n", nIters );
        else
            printf( "Reachability analysis completed after %d frames.\n", nIters );
        printf( "Reachable states = %.0f. (Ratio = %.4f %%)\n", nMints, 100.0*nMints/pow(2.0, Saig_ManRegNum(p->pAig)) );
        fflush( stdout ); 
    }
    if ( nIters >= p->pPars->nIterMax || nBddSize > p->pPars->nBddMax )
    {
        if ( !p->pPars->fSilent )
            printf( "Verified only for states reachable in %d frames.  ", nIters );
        p->pPars->iFrame = p->pPars->nIterMax;
        return -1; // undecided
    }
    // report
    if ( !p->pPars->fSilent )
        printf( "The miter is proved unreachable after %d iterations.  ", nIters );
    p->pPars->iFrame = nIters - 1;
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return 1; // unreachable
}